

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# softfloat-specialize.inc.c
# Opt level: O0

float128 propagateFloat128NaN(float128 a,float128 b,float_status *status)

{
  _Bool _Var1;
  flag fVar2;
  int iVar3;
  ulong uVar4;
  ulong uVar5;
  FloatClass local_4c;
  FloatClass local_48;
  bool local_41;
  FloatClass b_cls;
  FloatClass a_cls;
  flag aIsLargerSignificand;
  float_status *status_local;
  float128 b_local;
  float128 a_local;
  
  uVar4 = b.high;
  uVar5 = a.high;
  iVar3 = float128_is_any_nan(a);
  if (iVar3 == 0) {
    local_48 = float_class_normal;
  }
  else {
    iVar3 = float128_is_signaling_nan_tricore(a,status);
    local_48 = float_class_qnan;
    if (iVar3 != 0) {
      local_48 = float_class_snan;
    }
  }
  iVar3 = float128_is_any_nan(b);
  if (iVar3 == 0) {
    local_4c = float_class_normal;
  }
  else {
    iVar3 = float128_is_signaling_nan_tricore(b,status);
    local_4c = float_class_qnan;
    if (iVar3 != 0) {
      local_4c = float_class_snan;
    }
  }
  _Var1 = is_snan(local_48);
  if ((_Var1) || (_Var1 = is_snan(local_4c), _Var1)) {
    float_raise_tricore('\x01',status);
  }
  if (status->default_nan_mode == '\0') {
    fVar2 = lt128(uVar5 << 1,a.low,uVar4 << 1,b.low);
    if (fVar2 == '\0') {
      fVar2 = lt128(uVar4 << 1,b.low,uVar5 << 1,a.low);
      if (fVar2 == '\0') {
        local_41 = uVar5 < uVar4;
      }
      else {
        local_41 = true;
      }
    }
    else {
      local_41 = false;
    }
    iVar3 = pickNaN(local_48,local_4c,local_41);
    if (iVar3 == 0) {
      _Var1 = is_snan(local_48);
      unique0x10000221 = a;
      if (_Var1) {
        join_0x00000010_0x00000000_ = float128_silence_nan_tricore(a,status);
      }
    }
    else {
      _Var1 = is_snan(local_4c);
      unique0x10000231 = b;
      if (_Var1) {
        join_0x00000010_0x00000000_ = float128_silence_nan_tricore(b,status);
      }
    }
  }
  else {
    join_0x00000010_0x00000000_ = float128_default_nan_tricore(status);
  }
  return stack0xffffffffffffffe8;
}

Assistant:

static float128 propagateFloat128NaN(float128 a, float128 b,
                                     float_status *status)
{
    flag aIsLargerSignificand;
    FloatClass a_cls, b_cls;

    /* This is not complete, but is good enough for pickNaN.  */
    a_cls = (!float128_is_any_nan(a)
             ? float_class_normal
             : float128_is_signaling_nan(a, status)
             ? float_class_snan
             : float_class_qnan);
    b_cls = (!float128_is_any_nan(b)
             ? float_class_normal
             : float128_is_signaling_nan(b, status)
             ? float_class_snan
             : float_class_qnan);

    if (is_snan(a_cls) || is_snan(b_cls)) {
        float_raise(float_flag_invalid, status);
    }

    if (status->default_nan_mode) {
        return float128_default_nan(status);
    }

    if (lt128(a.high << 1, a.low, b.high << 1, b.low)) {
        aIsLargerSignificand = 0;
    } else if (lt128(b.high << 1, b.low, a.high << 1, a.low)) {
        aIsLargerSignificand = 1;
    } else {
        aIsLargerSignificand = (a.high < b.high) ? 1 : 0;
    }

    if (pickNaN(a_cls, b_cls, aIsLargerSignificand)) {
        if (is_snan(b_cls)) {
            return float128_silence_nan(b, status);
        }
        return b;
    } else {
        if (is_snan(a_cls)) {
            return float128_silence_nan(a, status);
        }
        return a;
    }
}